

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O3

int __thiscall FIX::FileStore::open(FileStore *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *__stream;
  ConfigError *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((FILE *)this->m_msgFile != (FILE *)0x0) {
    fclose((FILE *)this->m_msgFile);
  }
  if ((FILE *)this->m_headerFile != (FILE *)0x0) {
    fclose((FILE *)this->m_headerFile);
  }
  if ((FILE *)this->m_seqNumsFile != (FILE *)0x0) {
    fclose((FILE *)this->m_seqNumsFile);
  }
  if ((FILE *)this->m_sessionFile != (FILE *)0x0) {
    fclose((FILE *)this->m_sessionFile);
  }
  this->m_seqNumsFile = (FILE *)0x0;
  this->m_sessionFile = (FILE *)0x0;
  this->m_msgFile = (FILE *)0x0;
  this->m_headerFile = (FILE *)0x0;
  if ((char)__file != '\0') {
    file_unlink((this->m_msgFileName)._M_dataplus._M_p);
    file_unlink((this->m_headerFileName)._M_dataplus._M_p);
    file_unlink((this->m_seqNumsFileName)._M_dataplus._M_p);
    file_unlink((this->m_sessionFileName)._M_dataplus._M_p);
  }
  populateCache(this);
  pFVar3 = file_fopen((this->m_msgFileName)._M_dataplus._M_p,"r+");
  this->m_msgFile = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    pFVar3 = file_fopen((this->m_msgFileName)._M_dataplus._M_p,"w+");
    this->m_msgFile = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::operator+(&local_48,"Could not open body file: ",&this->m_msgFileName);
      ConfigError::ConfigError(pCVar4,&local_48);
      __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  pFVar3 = file_fopen((this->m_headerFileName)._M_dataplus._M_p,"r+");
  this->m_headerFile = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    pFVar3 = file_fopen((this->m_headerFileName)._M_dataplus._M_p,"w+");
    this->m_headerFile = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::operator+(&local_48,"Could not open header file: ",&this->m_headerFileName);
      ConfigError::ConfigError(pCVar4,&local_48);
      __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  pFVar3 = file_fopen((this->m_seqNumsFileName)._M_dataplus._M_p,"r+");
  this->m_seqNumsFile = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    pFVar3 = file_fopen((this->m_seqNumsFileName)._M_dataplus._M_p,"w+");
    this->m_seqNumsFile = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::operator+(&local_48,"Could not open seqnums file: ",&this->m_seqNumsFileName);
      ConfigError::ConfigError(pCVar4,&local_48);
      __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  __stream = (FILE *)file_fopen((this->m_sessionFileName)._M_dataplus._M_p,"r");
  this->m_sessionFile = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  pFVar3 = file_fopen((this->m_sessionFileName)._M_dataplus._M_p,"r+");
  this->m_sessionFile = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    pFVar3 = file_fopen((this->m_sessionFileName)._M_dataplus._M_p,"w+");
    this->m_sessionFile = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Could not open session file","");
      ConfigError::ConfigError(pCVar4,&local_48);
      __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  if (__stream == (FILE *)0x0) {
    setSession(this);
  }
  uVar1 = (*(this->super_MessageStore)._vptr_MessageStore[4])(this);
  (*(this->super_MessageStore)._vptr_MessageStore[6])(this,(ulong)uVar1);
  uVar1 = (*(this->super_MessageStore)._vptr_MessageStore[5])(this);
  iVar2 = (*(this->super_MessageStore)._vptr_MessageStore[7])(this,(ulong)uVar1);
  return iVar2;
}

Assistant:

void FileStore::open( bool deleteFile )
{
  if ( m_msgFile ) fclose( m_msgFile );
  if ( m_headerFile ) fclose( m_headerFile );
  if ( m_seqNumsFile ) fclose( m_seqNumsFile );
  if ( m_sessionFile ) fclose( m_sessionFile );

  m_msgFile = 0;
  m_headerFile = 0;
  m_seqNumsFile = 0;
  m_sessionFile = 0;

  if ( deleteFile )
  {
    file_unlink( m_msgFileName.c_str() );
    file_unlink( m_headerFileName.c_str() );
    file_unlink( m_seqNumsFileName.c_str() );
    file_unlink( m_sessionFileName.c_str() );
  }

  populateCache();
  m_msgFile = file_fopen( m_msgFileName.c_str(), "r+" );
  if ( !m_msgFile ) m_msgFile = file_fopen( m_msgFileName.c_str(), "w+" );
  if ( !m_msgFile ) throw ConfigError( "Could not open body file: " + m_msgFileName );

  m_headerFile = file_fopen( m_headerFileName.c_str(), "r+" );
  if ( !m_headerFile ) m_headerFile = file_fopen( m_headerFileName.c_str(), "w+" );
  if ( !m_headerFile ) throw ConfigError( "Could not open header file: " + m_headerFileName );

  m_seqNumsFile = file_fopen( m_seqNumsFileName.c_str(), "r+" );
  if ( !m_seqNumsFile ) m_seqNumsFile = file_fopen( m_seqNumsFileName.c_str(), "w+" );
  if ( !m_seqNumsFile ) throw ConfigError( "Could not open seqnums file: " + m_seqNumsFileName );

  bool setCreationTime = false;
  m_sessionFile = file_fopen( m_sessionFileName.c_str(), "r" );
  if ( !m_sessionFile ) setCreationTime = true;
  else fclose( m_sessionFile );

  m_sessionFile = file_fopen( m_sessionFileName.c_str(), "r+" );
  if ( !m_sessionFile ) m_sessionFile = file_fopen( m_sessionFileName.c_str(), "w+" );
  if ( !m_sessionFile ) throw ConfigError( "Could not open session file" );
  if ( setCreationTime ) setSession();

  setNextSenderMsgSeqNum( getNextSenderMsgSeqNum() );
  setNextTargetMsgSeqNum( getNextTargetMsgSeqNum() );
}